

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::draw_elements_instanced(NegativeTestContext *ctx)

{
  char *pcVar1;
  RenderContext *renderCtx;
  bool bVar2;
  ContextType ctxType;
  char *__s;
  mapped_type *pmVar3;
  long lVar4;
  GLfloat vertices [1];
  GLuint buf;
  GLuint tfID;
  GLuint fbo;
  ProgramSources sources;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ShaderProgram program;
  undefined1 auStack_2c8 [4];
  GLuint local_2c4;
  GLuint local_2c0;
  GLuint local_2bc;
  string local_2b8;
  string local_298;
  undefined1 local_278 [16];
  undefined1 local_268 [128];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1e8;
  undefined1 local_1c8 [32];
  string local_1a8;
  string local_188;
  StringTemplate local_168;
  StringTemplate local_148;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  undefined1 local_f8 [152];
  GLuint local_60;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_2bc = 0;
  local_2c4 = 0;
  local_2c0 = 0;
  local_128._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128._M_impl.super__Rb_tree_header._M_header;
  local_128._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128._M_impl.super__Rb_tree_header._M_header._M_left;
  __s = glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"GLSL_VERSION_STRING","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_128,(key_type *)local_f8);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,(ulong)__s);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  renderCtx = ctx->m_renderCtx;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_298,
             "${GLSL_VERSION_STRING}\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n","");
  tcu::StringTemplate::StringTemplate(&local_148,&local_298);
  tcu::StringTemplate::specialize
            (&local_188,&local_148,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_128);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,
             "${GLSL_VERSION_STRING}\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate(&local_168,&local_2b8);
  tcu::StringTemplate::specialize
            (&local_1a8,&local_168,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_128);
  local_1c8[0x10] = 0;
  local_1c8._17_8_ = 0;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8[8] = 0;
  local_1c8._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_278,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_278,&local_188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_268 + 8),&local_1a8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_f8,renderCtx,(ProgramSources *)local_278)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1e8);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_278 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_60);
  glu::CallLogWrapper::glVertexAttribDivisor(&ctx->super_CallLogWrapper,0,1);
  NegativeTestContext::expectError(ctx,0);
  local_278._0_8_ = (pointer)local_268;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,"GL_INVALID_ENUM is generated if mode is not an accepted value.",""
            );
  NegativeTestContext::beginSection(ctx,(string *)local_278);
  if ((pointer)local_278._0_8_ != (pointer)local_268) {
    operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
  }
  glu::CallLogWrapper::glDrawElementsInstanced
            (&ctx->super_CallLogWrapper,0xffffffff,1,0x1401,auStack_2c8,1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_278._0_8_ = (pointer)local_268;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,
             "GL_INVALID_ENUM is generated if type is not one of the accepted values.","");
  NegativeTestContext::beginSection(ctx,(string *)local_278);
  if ((pointer)local_278._0_8_ != (pointer)local_268) {
    operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
  }
  glu::CallLogWrapper::glDrawElementsInstanced
            (&ctx->super_CallLogWrapper,0,1,0xffffffff,auStack_2c8,1);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glDrawElementsInstanced(&ctx->super_CallLogWrapper,0,1,0x1406,auStack_2c8,1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_278._0_8_ = (pointer)local_268;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,"GL_INVALID_VALUE is generated if count or primcount are negative."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_278);
  if ((pointer)local_278._0_8_ != (pointer)local_268) {
    operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
  }
  glu::CallLogWrapper::glDrawElementsInstanced(&ctx->super_CallLogWrapper,0,-1,0x1401,auStack_2c8,1)
  ;
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glDrawElementsInstanced
            (&ctx->super_CallLogWrapper,0,0xb,0x1401,auStack_2c8,-1);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_278._0_8_ = (pointer)local_268;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,
             "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_278);
  if ((pointer)local_278._0_8_ != (pointer)local_268) {
    operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
  }
  glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,&local_2bc);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,local_2bc);
  glu::CallLogWrapper::glCheckFramebufferStatus(&ctx->super_CallLogWrapper,0x8d40);
  glu::CallLogWrapper::glDrawElementsInstanced(&ctx->super_CallLogWrapper,0,1,0x1401,auStack_2c8,1);
  NegativeTestContext::expectError(ctx,0x506);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,1,&local_2bc);
  NegativeTestContext::endSection(ctx);
  bVar2 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_EXT_geometry_shader");
  if (!bVar2) {
    local_278._0_8_ = (pointer)local_268;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,
               "GL_INVALID_OPERATION is generated if transform feedback is active and not paused.",
               "");
    NegativeTestContext::beginSection(ctx,(string *)local_278);
    if ((pointer)local_278._0_8_ != (pointer)local_268) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
    }
    local_278._0_8_ = "gl_Position";
    glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&local_2c4);
    glu::CallLogWrapper::glGenTransformFeedbacks(&ctx->super_CallLogWrapper,1,&local_2c0);
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_60);
    glu::CallLogWrapper::glTransformFeedbackVaryings
              (&ctx->super_CallLogWrapper,local_60,1,(GLchar **)local_278,0x8c8c);
    glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,local_60);
    glu::CallLogWrapper::glBindTransformFeedback(&ctx->super_CallLogWrapper,0x8e22,local_2c0);
    glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x8c8e,local_2c4);
    glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x8c8e,0x20,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBufferBase(&ctx->super_CallLogWrapper,0x8c8e,0,local_2c4);
    glu::CallLogWrapper::glBeginTransformFeedback(&ctx->super_CallLogWrapper,0);
    NegativeTestContext::expectError(ctx,0);
    glu::CallLogWrapper::glDrawElementsInstanced
              (&ctx->super_CallLogWrapper,0,1,0x1401,auStack_2c8,1);
    NegativeTestContext::expectError(ctx,0x502);
    glu::CallLogWrapper::glPauseTransformFeedback(&ctx->super_CallLogWrapper);
    glu::CallLogWrapper::glDrawElementsInstanced
              (&ctx->super_CallLogWrapper,0,1,0x1401,auStack_2c8,1);
    NegativeTestContext::expectError(ctx,0);
    glu::CallLogWrapper::glEndTransformFeedback(&ctx->super_CallLogWrapper);
    glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,&local_2c4);
    glu::CallLogWrapper::glDeleteTransformFeedbacks(&ctx->super_CallLogWrapper,1,&local_2c0);
    NegativeTestContext::expectError(ctx,0);
    NegativeTestContext::endSection(ctx);
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_128);
  return;
}

Assistant:

void draw_elements_instanced (NegativeTestContext& ctx)
{
	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	GLuint						fbo		= 0;
	GLuint						buf		= 0;
	GLuint						tfID	= 0;
	GLfloat						vertices[1];
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	glu::ShaderProgram			program	(ctx.getRenderContext(), glu::makeVtxFragSources(tcu::StringTemplate(vertexShaderSource).specialize(args), tcu::StringTemplate(fragmentShaderSource).specialize(args)));

	ctx.glUseProgram(program.getProgram());
	ctx.glVertexAttribDivisor(0, 1);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if mode is not an accepted value.");
	ctx.glDrawElementsInstanced(-1, 1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if type is not one of the accepted values.");
	ctx.glDrawElementsInstanced(GL_POINTS, 1, -1, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glDrawElementsInstanced(GL_POINTS, 1, GL_FLOAT, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if count or primcount are negative.");
	ctx.glDrawElementsInstanced(GL_POINTS, -1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glDrawElementsInstanced(GL_POINTS, 11, GL_UNSIGNED_BYTE, vertices, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");
	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ctx.glDrawElementsInstanced(GL_POINTS, 1, GL_UNSIGNED_BYTE, vertices, 1);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.endSection();

	if (!ctx.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader")) // GL_EXT_geometry_shader removes error
	{
		ctx.beginSection("GL_INVALID_OPERATION is generated if transform feedback is active and not paused.");
		const char* tfVarying = "gl_Position";

		ctx.glGenBuffers(1, &buf);
		ctx.glGenTransformFeedbacks(1, &tfID);

		ctx.glUseProgram(program.getProgram());
		ctx.glTransformFeedbackVaryings(program.getProgram(), 1, &tfVarying, GL_INTERLEAVED_ATTRIBS);
		ctx.glLinkProgram(program.getProgram());
		ctx.glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, tfID);
		ctx.glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buf);
		ctx.glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 32, DE_NULL, GL_DYNAMIC_DRAW);
		ctx.glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, buf);
		ctx.glBeginTransformFeedback(GL_POINTS);
		ctx.expectError(GL_NO_ERROR);

		ctx.glDrawElementsInstanced(GL_POINTS, 1, GL_UNSIGNED_BYTE, vertices, 1);
		ctx.expectError(GL_INVALID_OPERATION);

		ctx.glPauseTransformFeedback();
		ctx.glDrawElementsInstanced(GL_POINTS, 1, GL_UNSIGNED_BYTE, vertices, 1);
		ctx.expectError(GL_NO_ERROR);

		ctx.glEndTransformFeedback();
		ctx.glDeleteBuffers(1, &buf);
		ctx.glDeleteTransformFeedbacks(1, &tfID);
		ctx.expectError(GL_NO_ERROR);
		ctx.endSection();
	}

	ctx.glUseProgram(0);
}